

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConjugateGradient.cpp
# Opt level: O1

DynamicVector<double,_std::allocator<double>_> * __thiscall
QuantLib::ConjugateGradient::getUpdatedDirection
          (DynamicVector<double,_std::allocator<double>_> *__return_storage_ptr__,
          ConjugateGradient *this,Problem *P,RealType gold2,
          DynamicVector<double,_std::allocator<double>_> *param_3)

{
  pointer pdVar1;
  double *pdVar2;
  DynamicVector<double,_std::allocator<double>_> *result;
  long lVar3;
  DynamicVector<double,_std::allocator<double>_> tmp;
  allocator_type local_59;
  vector<double,_std::allocator<double>_> local_58;
  double local_40;
  DynamicVector<double,_std::allocator<double>_> local_38;
  
  local_40 = gold2;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_58,&(((this->super_LineSearchBasedMethod).lineSearch_)->gradient_).data_);
  for (pdVar2 = local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar2 != local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar2 = pdVar2 + 1) {
    *pdVar2 = -*pdVar2;
  }
  OpenMD::operator*(&local_38,P->squaredNorm_ / local_40,
                    &((this->super_LineSearchBasedMethod).lineSearch_)->searchDirection_);
  std::vector<double,_std::allocator<double>_>::vector
            (&__return_storage_ptr__->data_,
             (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3,&local_59);
  if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    pdVar1 = (__return_storage_ptr__->data_).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar3 = 0;
    do {
      pdVar2 = (double *)
               ((long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar3);
      *(double *)((long)pdVar1 + lVar3) =
           *pdVar2 + *(double *)
                      ((long)local_38.data_.super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar3);
      lVar3 = lVar3 + 8;
    } while (pdVar2 + 1 !=
             local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (local_38.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

DynamicVector<RealType> ConjugateGradient::getUpdatedDirection(
      const Problem& P, RealType gold2, const DynamicVector<RealType>&) {
    return -lineSearch_->lastGradient() +
           (P.gradientNormValue() / gold2) * lineSearch_->searchDirection();
  }